

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

ssize_t __thiscall
soplex::SPxSolverBase<double>::read
          (SPxSolverBase<double> *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  
  if (this->initialized == true) {
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x1b])(this);
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
    if (this->thepricer != (SPxPricer<double> *)0x0) {
      (*this->thepricer->_vptr_SPxPricer[2])();
    }
    if (this->theratiotester != (SPxRatioTester<double> *)0x0) {
      (*this->theratiotester->_vptr_SPxRatioTester[2])();
    }
  }
  (*(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase[8])(&this->super_SPxBasisBase<double>);
  sVar1 = SPxLPBase<double>::read(&this->super_SPxLPBase<double>,__fd,__buf,__nbytes);
  if ((char)sVar1 != '\0') {
    (this->super_SPxBasisBase<double>).theLP = this;
  }
  return sVar1;
}

Assistant:

bool SPxSolverBase<R>::read(std::istream& in, NameSet* rowNames,
                            NameSet* colNames, DIdxSet* intVars)
{
   if(initialized)
   {
      clear();
      unInit();

      if(thepricer)
         thepricer->clear();

      if(theratiotester)
         theratiotester->clear();
   }

   this->unLoad();

   if(!SPxLPBase<R>::read(in, rowNames, colNames, intVars))
      return false;

   this->theLP = this;

   return true;
}